

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_dec.c
# Opt level: O0

void CopySmallPattern32b(uint32_t *src,uint32_t *dst,int length,uint64_t pattern)

{
  int i;
  uint64_t pattern_local;
  int length_local;
  uint32_t *dst_local;
  uint32_t *src_local;
  
  pattern_local = pattern;
  length_local = length;
  dst_local = dst;
  src_local = src;
  if (((ulong)dst & 4) != 0) {
    src_local = src + 1;
    dst_local = dst + 1;
    *dst = *src;
    pattern_local = pattern >> 0x20 | pattern << 0x20;
    length_local = length + -1;
  }
  for (i = 0; i < length_local >> 1; i = i + 1) {
    *(uint64_t *)(dst_local + (long)i * 2) = pattern_local;
  }
  if ((length_local & 1U) != 0) {
    dst_local[i << 1] = src_local[i << 1];
  }
  return;
}

Assistant:

static WEBP_INLINE void CopySmallPattern32b(const uint32_t* src,
                                            uint32_t* dst,
                                            int length, uint64_t pattern) {
  int i;
  if ((uintptr_t)dst & 4) {           // Align 'dst' to 8-bytes boundary.
    *dst++ = *src++;
    pattern = (pattern >> 32) | (pattern << 32);
    --length;
  }
  assert(0 == ((uintptr_t)dst & 7));
  for (i = 0; i < (length >> 1); ++i) {
    ((uint64_t*)dst)[i] = pattern;    // Copy the pattern 8 bytes at a time.
  }
  if (length & 1) {                   // Finish with left-over.
    dst[i << 1] = src[i << 1];
  }
}